

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::UnfinishedSections::UnfinishedSections
          (UnfinishedSections *this,SectionInfo *_info,Counts *_prevAssertions,
          double _durationInSeconds)

{
  double _durationInSeconds_local;
  Counts *_prevAssertions_local;
  SectionInfo *_info_local;
  UnfinishedSections *this_local;
  
  SectionInfo::SectionInfo(&this->info,_info);
  (this->prevAssertions).passed = _prevAssertions->passed;
  (this->prevAssertions).failed = _prevAssertions->failed;
  this->durationInSeconds = _durationInSeconds;
  return;
}

Assistant:

UnfinishedSections( SectionInfo const& _info, Counts const& _prevAssertions, double _durationInSeconds )
            : info( _info ), prevAssertions( _prevAssertions ), durationInSeconds( _durationInSeconds )
            {}